

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
SerialSimulationDataGenerator::CreateSerialByte(SerialSimulationDataGenerator *this,U64 value)

{
  Parity PVar1;
  SerialAnalyzerSettings *pSVar2;
  uint uVar3;
  BitState BVar4;
  ulong uVar5;
  bool bVar6;
  BitExtractor bit_extractor;
  BitExtractor aBStack_38 [8];
  
  BVar4 = (int)this + 0x40;
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptor::Advance(BVar4);
  pSVar2 = this->mSettings;
  uVar5 = value ^ -(ulong)pSVar2->mInverted;
  uVar3 = (pSVar2->mBitsPerTransfer + 1) - (uint)(pSVar2->mSerialMode == Normal);
  BitExtractor::BitExtractor(aBStack_38,uVar5,pSVar2->mShiftOrder,uVar3);
  while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
    BitExtractor::GetNextBit();
    SimulationChannelDescriptor::TransitionIfNeeded(BVar4);
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptor::Advance(BVar4);
  }
  PVar1 = this->mSettings->mParity;
  if (PVar1 == Even) {
    uVar3 = AnalyzerHelpers::GetOnesCount(uVar5);
    AnalyzerHelpers::IsEven((ulong)uVar3);
  }
  else {
    if (PVar1 != Odd) goto LAB_00108012;
    uVar3 = AnalyzerHelpers::GetOnesCount(uVar5);
    AnalyzerHelpers::IsOdd((ulong)uVar3);
  }
  SimulationChannelDescriptor::TransitionIfNeeded(BVar4);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptor::Advance(BVar4);
LAB_00108012:
  SimulationChannelDescriptor::TransitionIfNeeded(BVar4);
  ClockGenerator::AdvanceByHalfPeriod(this->mSettings->mStopBits);
  SimulationChannelDescriptor::Advance(BVar4);
  BitExtractor::~BitExtractor(aBStack_38);
  return;
}

Assistant:

void SerialSimulationDataGenerator::CreateSerialByte( U64 value )
{
    // assume we start high

    mSerialSimulationData.Transition();                                     // low-going edge for start bit
    mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() ); // add start bit time

    if( mSettings->mInverted == true )
        value = ~value;

    U32 num_bits = mSettings->mBitsPerTransfer;
    if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        num_bits++;

    BitExtractor bit_extractor( value, mSettings->mShiftOrder, num_bits );

    for( U32 i = 0; i < num_bits; i++ )
    {
        mSerialSimulationData.TransitionIfNeeded( bit_extractor.GetNextBit() );
        mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }

    if( mSettings->mParity == AnalyzerEnums::Even )
    {
        if( AnalyzerHelpers::IsEven( AnalyzerHelpers::GetOnesCount( value ) ) == true )
            mSerialSimulationData.TransitionIfNeeded( mBitLow ); // we want to add a zero bit
        else
            mSerialSimulationData.TransitionIfNeeded( mBitHigh ); // we want to add a one bit

        mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }
    else if( mSettings->mParity == AnalyzerEnums::Odd )
    {
        if( AnalyzerHelpers::IsOdd( AnalyzerHelpers::GetOnesCount( value ) ) == true )
            mSerialSimulationData.TransitionIfNeeded( mBitLow ); // we want to add a zero bit
        else
            mSerialSimulationData.TransitionIfNeeded( mBitHigh );

        mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }

    mSerialSimulationData.TransitionIfNeeded( mBitHigh ); // we need to end high

    // let's pad the end a bit for the stop bit:
    mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( mSettings->mStopBits ) );
}